

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::isAdjoint(Graph *this)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int j;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  
  if (this->multigraph_status == true) {
    std::operator<<((ostream *)&std::cerr,"Graph is multigraph! Can\'t be adjoint!");
    exit(1);
  }
  uVar5 = (ulong)this->num_of_vert;
  if (0 < (long)uVar5) {
    uVar6 = 0;
    uVar4 = 0;
    do {
      piVar1 = this->adj_list[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar2 = this->adj_list[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar1 != piVar2) {
        uVar10 = (long)piVar2 - (long)piVar1 >> 2;
        bVar13 = true;
        uVar7 = 0;
        do {
          if ((uVar6 != uVar7) &&
             ((piVar1 != piVar2 ||
              (this->adj_list[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start !=
               this->adj_list[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish)))) {
            if ((int)(uint)uVar10 < 1) {
              iVar12 = 0;
            }
            else {
              piVar3 = this->adj_list[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar11 = (long)this->adj_list[uVar7].super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
              uVar9 = uVar11;
              if (uVar11 < uVar10) {
                uVar9 = uVar10;
              }
              uVar8 = 0;
              iVar12 = 0;
              do {
                if (0 < (int)(uint)uVar11) {
                  uVar4 = 0;
                  do {
                    iVar12 = iVar12 + (uint)(piVar1[uVar8] == piVar3[uVar4]);
                    uVar4 = uVar4 + 1;
                  } while (((uint)uVar11 & 0x7fffffff) != uVar4);
                  uVar4 = uVar9 & 0xffffffff;
                }
                uVar8 = uVar8 + 1;
              } while (uVar8 != ((uint)uVar10 & 0x7fffffff));
            }
            if (iVar12 != (int)uVar4 && iVar12 != 0) {
              this->adjoint_status = false;
              break;
            }
          }
          uVar7 = uVar7 + 1;
          bVar13 = uVar7 < uVar5;
        } while (uVar7 != uVar5);
        if (bVar13) {
          return;
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
  return;
}

Assistant:

void Graph::isAdjoint(){
   if(this->multigraph_status){
      cerr << "Graph is multigraph! Can't be adjoint!";
      exit(EXIT_FAILURE);
   }
   int nv = this->num_of_vert, size = 0, common_els = 0;
   for(int i = 0; i < nv; i++){
      // checks if there is any vertex that has any successors
      if(not(this->adj_list[i].empty()))
         for(int j = 0; j < nv; j++){
            if (i == j)
               continue;
            common_els = 0;
            if(this->adj_list[i].empty() and this->adj_list[j].empty())
               continue;
            for(int k = 0; k < (int)this->adj_list[i].size(); k++){
               for(int l = 0; l < (int)this->adj_list[j].size(); l++){
                  // sets the number of our common elements
                  if(this->adj_list[i].size() >= this->adj_list[j].size())
                     size = (int)this->adj_list[i].size();
                  else
                     size = (int)this->adj_list[j].size();
                  // if we found common element, then we increment
                  if(this->adj_list[i][k] == this->adj_list[j][l])
                     common_els++;
               }
            }
            // graph not adjoint; common elements for two vertices are not equal and this is not empty set
            if((common_els not_eq size) and
               (common_els not_eq 0)){
               this->adjoint_status = false;
               return void();
            }
         }
   }
   return void();
}